

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void printInfo(char *fileName)

{
  long *plVar1;
  bool bVar2;
  byte bVar3;
  char cVar4;
  int iVar5;
  uint uVar6;
  size_t sVar7;
  ostream *poVar8;
  _Rb_tree_node_base *p_Var9;
  _Rb_tree_node_base *p_Var10;
  long lVar11;
  int iVar12;
  char *pcVar13;
  undefined8 *puVar14;
  MultiPartInputFile in;
  char local_69;
  int local_68;
  int local_64;
  long local_60;
  MultiPartInputFile local_58 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_50;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_40;
  TimeCode local_38 [8];
  
  iVar5 = Imf_3_4::globalThreadCount();
  Imf_3_4::MultiPartInputFile::MultiPartInputFile(local_58,fileName,iVar5,true);
  local_64 = Imf_3_4::MultiPartInputFile::parts();
  if (local_64 < 1) {
    bVar3 = 1;
  }
  else {
    iVar5 = 1;
    do {
      bVar3 = Imf_3_4::MultiPartInputFile::partComplete((int)local_58);
      bVar2 = iVar5 < local_64;
      iVar5 = iVar5 + 1;
    } while ((bVar2 & bVar3) != 0);
  }
  iVar5 = local_64;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\nfile ",6);
  if (fileName == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1091a8);
  }
  else {
    sVar7 = strlen(fileName);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,fileName,sVar7);
  }
  pcVar13 = " (incomplete)";
  if (bVar3 != 0) {
    pcVar13 = "";
  }
  lVar11 = 0xd;
  if (bVar3 != 0) {
    lVar11 = 0;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar13,lVar11);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":\n\n",3);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"file format version: ",0x15);
  bVar3 = Imf_3_4::MultiPartInputFile::version();
  poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(uint)bVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,", flags 0x",10);
  *(uint *)(poVar8 + *(long *)(*(long *)poVar8 + -0x18) + 0x18) =
       *(uint *)(poVar8 + *(long *)(*(long *)poVar8 + -0x18) + 0x18) & 0xffffffb5 | 8;
  uVar6 = Imf_3_4::MultiPartInputFile::version();
  poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,uVar6 & 0xffffff00);
  *(uint *)(poVar8 + *(long *)(*(long *)poVar8 + -0x18) + 0x18) =
       *(uint *)(poVar8 + *(long *)(*(long *)poVar8 + -0x18) + 0x18) & 0xffffffb5 | 2;
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
  if (0 < iVar5) {
    iVar12 = 0;
    do {
      local_68 = iVar12;
      Imf_3_4::MultiPartInputFile::header((int)local_58);
      if (iVar5 != 1) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n\n part ",8);
        poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_68);
        cVar4 = Imf_3_4::MultiPartInputFile::partComplete((int)local_58);
        pcVar13 = " (incomplete)";
        if (cVar4 != '\0') {
          pcVar13 = "";
        }
        lVar11 = 0xd;
        if (cVar4 != '\0') {
          lVar11 = 0;
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,pcVar13,lVar11);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,":\n",2);
      }
      p_Var9 = (_Rb_tree_node_base *)Imf_3_4::Header::begin();
      while (p_Var10 = (_Rb_tree_node_base *)Imf_3_4::Header::end(), p_Var9 != p_Var10) {
        plVar1 = *(long **)(p_Var9 + 9);
        sVar7 = strlen((char *)(p_Var9 + 1));
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,(char *)(p_Var9 + 1),sVar7);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," (type ",7);
        pcVar13 = (char *)(**(code **)(*plVar1 + 0x10))(plVar1);
        if (pcVar13 == (char *)0x0) {
          std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1091a8);
        }
        else {
          sVar7 = strlen(pcVar13);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar13,sVar7);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
        lVar11 = __dynamic_cast(plVar1,&Imf_3_4::Attribute::typeinfo,
                                &Imf_3_4::TypedAttribute<Imath_3_2::Box<Imath_3_2::Vec2<int>>>::
                                 typeinfo,0);
        if (lVar11 == 0) {
          lVar11 = __dynamic_cast(plVar1,&Imf_3_4::Attribute::typeinfo,
                                  &Imf_3_4::TypedAttribute<Imath_3_2::Box<Imath_3_2::Vec2<float>>>::
                                   typeinfo,0);
          if (lVar11 == 0) {
            lVar11 = __dynamic_cast(plVar1,&Imf_3_4::Attribute::typeinfo,
                                    &Imf_3_4::TypedAttribute<Imf_3_4::ChannelList>::typeinfo,0);
            if (lVar11 == 0) {
              lVar11 = __dynamic_cast(plVar1,&Imf_3_4::Attribute::typeinfo,
                                      &Imf_3_4::TypedAttribute<Imf_3_4::Chromaticities>::typeinfo,0)
              ;
              if (lVar11 == 0) {
                lVar11 = __dynamic_cast(plVar1,&Imf_3_4::Attribute::typeinfo,
                                        &Imf_3_4::TypedAttribute<Imf_3_4::Compression>::typeinfo,0);
                if (lVar11 == 0) {
                  lVar11 = __dynamic_cast(plVar1,&Imf_3_4::Attribute::typeinfo,
                                          &Imf_3_4::TypedAttribute<double>::typeinfo,0);
                  if (lVar11 == 0) {
                    lVar11 = __dynamic_cast(plVar1,&Imf_3_4::Attribute::typeinfo,
                                            &Imf_3_4::TypedAttribute<Imf_3_4::Envmap>::typeinfo,0);
                    if (lVar11 == 0) {
                      lVar11 = __dynamic_cast(plVar1,&Imf_3_4::Attribute::typeinfo,
                                              &Imf_3_4::TypedAttribute<float>::typeinfo,0);
                      if (lVar11 == 0) {
                        lVar11 = __dynamic_cast(plVar1,&Imf_3_4::Attribute::typeinfo,
                                                &Imf_3_4::TypedAttribute<int>::typeinfo,0);
                        if (lVar11 == 0) {
                          lVar11 = __dynamic_cast(plVar1,&Imf_3_4::Attribute::typeinfo,
                                                  &Imf_3_4::TypedAttribute<Imf_3_4::KeyCode>::
                                                   typeinfo,0);
                          if (lVar11 == 0) {
                            lVar11 = __dynamic_cast(plVar1,&Imf_3_4::Attribute::typeinfo,
                                                    &Imf_3_4::TypedAttribute<Imf_3_4::LineOrder>::
                                                     typeinfo,0);
                            if (lVar11 == 0) {
                              lVar11 = __dynamic_cast(plVar1,&Imf_3_4::Attribute::typeinfo,
                                                      &Imf_3_4::
                                                  TypedAttribute<Imath_3_2::Matrix33<float>>::
                                                  typeinfo,0);
                              if (lVar11 == 0) {
                                lVar11 = __dynamic_cast(plVar1,&Imf_3_4::Attribute::typeinfo,
                                                        &Imf_3_4::
                                                  TypedAttribute<Imath_3_2::Matrix44<float>>::
                                                  typeinfo,0);
                                if (lVar11 == 0) {
                                  lVar11 = __dynamic_cast(plVar1,&Imf_3_4::Attribute::typeinfo,
                                                          &Imf_3_4::
                                                  TypedAttribute<Imf_3_4::PreviewImage>::typeinfo,0)
                                  ;
                                  if (lVar11 == 0) {
                                    lVar11 = __dynamic_cast(plVar1,&Imf_3_4::Attribute::typeinfo,
                                                            &Imf_3_4::
                                                  TypedAttribute<std::__cxx11::string>::typeinfo,0);
                                    if (lVar11 == 0) {
                                      lVar11 = __dynamic_cast(plVar1,&Imf_3_4::Attribute::typeinfo,
                                                              &Imf_3_4::
                                                  TypedAttribute<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                                                  ::typeinfo,0);
                                      if (lVar11 == 0) {
                                        lVar11 = __dynamic_cast(plVar1,&Imf_3_4::Attribute::typeinfo
                                                                ,&Imf_3_4::
                                                  TypedAttribute<Imf_3_4::Rational>::typeinfo,0);
                                        if (lVar11 == 0) {
                                          local_60 = __dynamic_cast(plVar1,&Imf_3_4::Attribute::
                                                                            typeinfo,
                                                                    &Imf_3_4::
                                                  TypedAttribute<Imf_3_4::TileDescription>::typeinfo
                                                  ,0);
                                          if (local_60 == 0) {
                                            lVar11 = __dynamic_cast(plVar1,&Imf_3_4::Attribute::
                                                                            typeinfo,
                                                                    &Imf_3_4::
                                                  TypedAttribute<Imf_3_4::TimeCode>::typeinfo,0);
                                            if (lVar11 == 0) {
                                              lVar11 = __dynamic_cast(plVar1,&Imf_3_4::Attribute::
                                                                              typeinfo,
                                                                      &Imf_3_4::
                                                  TypedAttribute<Imath_3_2::Vec2<int>>::typeinfo,0);
                                              if (lVar11 == 0) {
                                                lVar11 = __dynamic_cast(plVar1,&Imf_3_4::Attribute::
                                                                                typeinfo,
                                                                        &Imf_3_4::
                                                  TypedAttribute<Imath_3_2::Vec2<float>>::typeinfo,0
                                                  );
                                                if (lVar11 == 0) {
                                                  lVar11 = __dynamic_cast(plVar1,&Imf_3_4::Attribute
                                                                                  ::typeinfo,
                                                                          &Imf_3_4::
                                                  TypedAttribute<Imath_3_2::Vec3<int>>::typeinfo,0);
                                                  if (lVar11 == 0) {
                                                    lVar11 = __dynamic_cast(plVar1,&Imf_3_4::
                                                  Attribute::typeinfo,
                                                  &Imf_3_4::TypedAttribute<Imath_3_2::Vec3<float>>::
                                                   typeinfo,0);
                                                  if (lVar11 != 0) {
                                                    std::
                                                  __ostream_insert<char,std::char_traits<char>>
                                                            ((ostream *)&std::cout,": ",2);
                                                  Imath_3_2::operator<<
                                                            ((ostream *)&std::cout,
                                                             (Vec3<float> *)(lVar11 + 8));
                                                  }
                                                  }
                                                  else {
                                                    std::
                                                  __ostream_insert<char,std::char_traits<char>>
                                                            ((ostream *)&std::cout,": ",2);
                                                  Imath_3_2::operator<<
                                                            ((ostream *)&std::cout,
                                                             (Vec3<int> *)(lVar11 + 8));
                                                  }
                                                }
                                                else {
                                                  std::__ostream_insert<char,std::char_traits<char>>
                                                            ((ostream *)&std::cout,": ",2);
                                                  Imath_3_2::operator<<
                                                            ((ostream *)&std::cout,
                                                             (Vec2<float> *)(lVar11 + 8));
                                                }
                                              }
                                              else {
                                                std::__ostream_insert<char,std::char_traits<char>>
                                                          ((ostream *)&std::cout,": ",2);
                                                Imath_3_2::operator<<
                                                          ((ostream *)&std::cout,
                                                           (Vec2<int> *)(lVar11 + 8));
                                              }
                                            }
                                            else {
                                              std::__ostream_insert<char,std::char_traits<char>>
                                                        ((ostream *)&std::cout,":\n",2);
                                              Imf_3_4::TimeCode::TimeCode
                                                        (local_38,(TimeCode *)(lVar11 + 8));
                                              printTimeCode(local_38);
                                            }
                                          }
                                          else {
                                            std::__ostream_insert<char,std::char_traits<char>>
                                                      ((ostream *)&std::cout,":\n    ",6);
                                            printLevelMode(*(LevelMode *)(local_60 + 0x10));
                                            std::__ostream_insert<char,std::char_traits<char>>
                                                      ((ostream *)&std::cout,"\n    tile size ",0xf)
                                            ;
                                            poVar8 = std::ostream::_M_insert<unsigned_long>
                                                               ((ulong)&std::cout);
                                            std::__ostream_insert<char,std::char_traits<char>>
                                                      (poVar8," by ",4);
                                            poVar8 = std::ostream::_M_insert<unsigned_long>
                                                               ((ulong)poVar8);
                                            std::__ostream_insert<char,std::char_traits<char>>
                                                      (poVar8," pixels",7);
                                            if (*(int *)(local_60 + 0x10) != 0) {
                                              std::__ostream_insert<char,std::char_traits<char>>
                                                        ((ostream *)&std::cout,
                                                         "\n    level sizes rounded ",0x19);
                                              printLevelRoundingMode
                                                        (*(LevelRoundingMode *)(local_60 + 0x14));
                                            }
                                          }
                                        }
                                        else {
                                          std::__ostream_insert<char,std::char_traits<char>>
                                                    ((ostream *)&std::cout,": ",2);
                                          poVar8 = (ostream *)
                                                   std::ostream::operator<<
                                                             ((ostream *)&std::cout,
                                                              *(int *)(lVar11 + 8));
                                          std::__ostream_insert<char,std::char_traits<char>>
                                                    (poVar8,"/",1);
                                          poVar8 = std::ostream::_M_insert<unsigned_long>
                                                             ((ulong)poVar8);
                                          std::__ostream_insert<char,std::char_traits<char>>
                                                    (poVar8," (",2);
                                          poVar8 = std::ostream::_M_insert<double>
                                                             ((double)*(int *)(lVar11 + 8) /
                                                              (double)*(uint *)(lVar11 + 0xc));
                                          std::__ostream_insert<char,std::char_traits<char>>
                                                    (poVar8,")",1);
                                        }
                                      }
                                      else {
                                        std::__ostream_insert<char,std::char_traits<char>>
                                                  ((ostream *)&std::cout,":",1);
                                        for (puVar14 = *(undefined8 **)(lVar11 + 8);
                                            puVar14 != *(undefined8 **)(lVar11 + 0x10);
                                            puVar14 = puVar14 + 4) {
                                          std::__ostream_insert<char,std::char_traits<char>>
                                                    ((ostream *)&std::cout,"\n    \"",6);
                                          poVar8 = std::
                                                  __ostream_insert<char,std::char_traits<char>>
                                                            ((ostream *)&std::cout,(char *)*puVar14,
                                                             puVar14[1]);
                                          std::__ostream_insert<char,std::char_traits<char>>
                                                    (poVar8,"\"",1);
                                        }
                                      }
                                    }
                                    else {
                                      std::__ostream_insert<char,std::char_traits<char>>
                                                ((ostream *)&std::cout,": \"",3);
                                      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                                         ((ostream *)&std::cout,
                                                          *(char **)(lVar11 + 8),
                                                          *(long *)(lVar11 + 0x10));
                                      std::__ostream_insert<char,std::char_traits<char>>
                                                (poVar8,"\"",1);
                                    }
                                  }
                                  else {
                                    std::__ostream_insert<char,std::char_traits<char>>
                                              ((ostream *)&std::cout,": ",2);
                                    poVar8 = std::ostream::_M_insert<unsigned_long>
                                                       ((ulong)&std::cout);
                                    std::__ostream_insert<char,std::char_traits<char>>
                                              (poVar8," by ",4);
                                    poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
                                    std::__ostream_insert<char,std::char_traits<char>>
                                              (poVar8," pixels",7);
                                  }
                                }
                                else {
                                  std::__ostream_insert<char,std::char_traits<char>>
                                            ((ostream *)&std::cout,":\n   (",6);
                                  poVar8 = std::ostream::_M_insert<double>
                                                     ((double)*(float *)(lVar11 + 8));
                                  std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
                                  poVar8 = std::ostream::_M_insert<double>
                                                     ((double)*(float *)(lVar11 + 0xc));
                                  std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
                                  poVar8 = std::ostream::_M_insert<double>
                                                     ((double)*(float *)(lVar11 + 0x10));
                                  std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
                                  poVar8 = std::ostream::_M_insert<double>
                                                     ((double)*(float *)(lVar11 + 0x14));
                                  std::__ostream_insert<char,std::char_traits<char>>
                                            (poVar8,"\n    ",5);
                                  poVar8 = std::ostream::_M_insert<double>
                                                     ((double)*(float *)(lVar11 + 0x18));
                                  std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
                                  poVar8 = std::ostream::_M_insert<double>
                                                     ((double)*(float *)(lVar11 + 0x1c));
                                  std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
                                  poVar8 = std::ostream::_M_insert<double>
                                                     ((double)*(float *)(lVar11 + 0x20));
                                  std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
                                  poVar8 = std::ostream::_M_insert<double>
                                                     ((double)*(float *)(lVar11 + 0x24));
                                  std::__ostream_insert<char,std::char_traits<char>>
                                            (poVar8,"\n    ",5);
                                  poVar8 = std::ostream::_M_insert<double>
                                                     ((double)*(float *)(lVar11 + 0x28));
                                  std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
                                  poVar8 = std::ostream::_M_insert<double>
                                                     ((double)*(float *)(lVar11 + 0x2c));
                                  std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
                                  poVar8 = std::ostream::_M_insert<double>
                                                     ((double)*(float *)(lVar11 + 0x30));
                                  std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
                                  poVar8 = std::ostream::_M_insert<double>
                                                     ((double)*(float *)(lVar11 + 0x34));
                                  std::__ostream_insert<char,std::char_traits<char>>
                                            (poVar8,"\n    ",5);
                                  poVar8 = std::ostream::_M_insert<double>
                                                     ((double)*(float *)(lVar11 + 0x38));
                                  std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
                                  poVar8 = std::ostream::_M_insert<double>
                                                     ((double)*(float *)(lVar11 + 0x3c));
                                  std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
                                  poVar8 = std::ostream::_M_insert<double>
                                                     ((double)*(float *)(lVar11 + 0x40));
                                  std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
                                  poVar8 = std::ostream::_M_insert<double>
                                                     ((double)*(float *)(lVar11 + 0x44));
                                  std::__ostream_insert<char,std::char_traits<char>>(poVar8,")",1);
                                }
                              }
                              else {
                                std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)&std::cout,":\n   (",6);
                                poVar8 = std::ostream::_M_insert<double>
                                                   ((double)*(float *)(lVar11 + 8));
                                std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
                                poVar8 = std::ostream::_M_insert<double>
                                                   ((double)*(float *)(lVar11 + 0xc));
                                std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
                                poVar8 = std::ostream::_M_insert<double>
                                                   ((double)*(float *)(lVar11 + 0x10));
                                std::__ostream_insert<char,std::char_traits<char>>
                                          (poVar8,"\n    ",5);
                                poVar8 = std::ostream::_M_insert<double>
                                                   ((double)*(float *)(lVar11 + 0x14));
                                std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
                                poVar8 = std::ostream::_M_insert<double>
                                                   ((double)*(float *)(lVar11 + 0x18));
                                std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
                                poVar8 = std::ostream::_M_insert<double>
                                                   ((double)*(float *)(lVar11 + 0x1c));
                                std::__ostream_insert<char,std::char_traits<char>>
                                          (poVar8,"\n    ",5);
                                poVar8 = std::ostream::_M_insert<double>
                                                   ((double)*(float *)(lVar11 + 0x20));
                                std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
                                poVar8 = std::ostream::_M_insert<double>
                                                   ((double)*(float *)(lVar11 + 0x24));
                                std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
                                poVar8 = std::ostream::_M_insert<double>
                                                   ((double)*(float *)(lVar11 + 0x28));
                                std::__ostream_insert<char,std::char_traits<char>>(poVar8,")",1);
                              }
                            }
                            else {
                              std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)&std::cout,": ",2);
                              printLineOrder(*(LineOrder *)(lVar11 + 8));
                            }
                          }
                          else {
                            std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)&std::cout,":\n    film manufacturer code ",0x1d);
                            iVar5 = Imf_3_4::KeyCode::filmMfcCode();
                            poVar8 = (ostream *)
                                     std::ostream::operator<<((ostream *)&std::cout,iVar5);
                            std::__ostream_insert<char,std::char_traits<char>>
                                      (poVar8,"\n    film type code ",0x14);
                            iVar5 = Imf_3_4::KeyCode::filmType();
                            poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,iVar5);
                            std::__ostream_insert<char,std::char_traits<char>>
                                      (poVar8,"\n    prefix ",0xc);
                            iVar5 = Imf_3_4::KeyCode::prefix();
                            poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,iVar5);
                            std::__ostream_insert<char,std::char_traits<char>>
                                      (poVar8,"\n    count ",0xb);
                            iVar5 = Imf_3_4::KeyCode::count();
                            poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,iVar5);
                            std::__ostream_insert<char,std::char_traits<char>>
                                      (poVar8,"\n    perf offset ",0x11);
                            iVar5 = Imf_3_4::KeyCode::perfOffset();
                            poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,iVar5);
                            std::__ostream_insert<char,std::char_traits<char>>
                                      (poVar8,"\n    perfs per frame ",0x15);
                            iVar5 = Imf_3_4::KeyCode::perfsPerFrame();
                            poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,iVar5);
                            std::__ostream_insert<char,std::char_traits<char>>
                                      (poVar8,"\n    perfs per count ",0x15);
                            iVar5 = Imf_3_4::KeyCode::perfsPerCount();
                            std::ostream::operator<<((ostream *)poVar8,iVar5);
                          }
                        }
                        else {
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cout,": ",2);
                          std::ostream::operator<<((ostream *)&std::cout,*(int *)(lVar11 + 8));
                        }
                      }
                      else {
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cout,": ",2);
                        std::ostream::_M_insert<double>((double)*(float *)(lVar11 + 8));
                      }
                    }
                    else {
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,": ",2);
                      printEnvmap((Envmap *)(lVar11 + 8));
                    }
                  }
                  else {
                    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,": ",2)
                    ;
                    std::ostream::_M_insert<double>(*(double *)(lVar11 + 8));
                  }
                }
                else {
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,": ",2);
                  printCompression(*(Compression *)(lVar11 + 8));
                }
              }
              else {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,":\n    red   ",0xc);
                poVar8 = Imath_3_2::operator<<((ostream *)&std::cout,(Vec2<float> *)(lVar11 + 8));
                std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n    green ",0xb);
                poVar8 = Imath_3_2::operator<<(poVar8,(Vec2<float> *)(lVar11 + 0x10));
                std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n    blue  ",0xb);
                poVar8 = Imath_3_2::operator<<(poVar8,(Vec2<float> *)(lVar11 + 0x18));
                std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n    white ",0xb);
                Imath_3_2::operator<<(poVar8,(Vec2<float> *)(lVar11 + 0x20));
              }
            }
            else {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
              printChannelList((ChannelList *)(lVar11 + 8));
            }
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,": ",2);
            poVar8 = Imath_3_2::operator<<((ostream *)&std::cout,(Vec2<float> *)(lVar11 + 8));
            std::__ostream_insert<char,std::char_traits<char>>(poVar8," - ",3);
            Imath_3_2::operator<<(poVar8,(Vec2<float> *)(lVar11 + 0x10));
          }
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,": ",2);
          poVar8 = Imath_3_2::operator<<((ostream *)&std::cout,(Vec2<int> *)(lVar11 + 8));
          std::__ostream_insert<char,std::char_traits<char>>(poVar8," - ",3);
          Imath_3_2::operator<<(poVar8,(Vec2<int> *)(lVar11 + 0x10));
        }
        local_69 = '\n';
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,&local_69,1);
        p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9);
        iVar5 = local_64;
      }
      iVar12 = local_68 + 1;
    } while (iVar12 != iVar5);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
  std::ostream::put(-0x58);
  std::ostream::flush();
  if (local_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_40);
  }
  if (local_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50);
  }
  return;
}

Assistant:

void
printInfo (const char fileName[])
{
    MultiPartInputFile in (fileName);
    int                parts = in.parts ();

    //
    // Check to see if any parts are incomplete
    //

    bool fileComplete = true;

    for (int i = 0; i < parts && fileComplete; ++i)
        if (!in.partComplete (i)) fileComplete = false;

    //
    // Print file name and file format version
    //

    cout << "\nfile " << fileName << (fileComplete ? "" : " (incomplete)")
         << ":\n\n";

    cout << "file format version: " << getVersion (in.version ())
         << ", "
            "flags 0x"
         << setbase (16) << getFlags (in.version ()) << setbase (10) << "\n";

    //
    // Print the header of every part in the file
    //

    for (int p = 0; p < parts; ++p)
    {
        const Header& h = in.header (p);

        if (parts != 1)
        {
            cout << "\n\n part " << p
                 << (in.partComplete (p) ? "" : " (incomplete)") << ":\n";
        }

        for (Header::ConstIterator i = h.begin (); i != h.end (); ++i)
        {
            const Attribute* a = &i.attribute ();
            cout << i.name () << " (type " << a->typeName () << ")";

            if (const Box2iAttribute* ta =
                    dynamic_cast<const Box2iAttribute*> (a))
            {
                cout << ": " << ta->value ().min << " - " << ta->value ().max;
            }

            else if (
                const Box2fAttribute* ta =
                    dynamic_cast<const Box2fAttribute*> (a))
            {
                cout << ": " << ta->value ().min << " - " << ta->value ().max;
            }
            else if (
                const ChannelListAttribute* ta =
                    dynamic_cast<const ChannelListAttribute*> (a))
            {
                cout << ":";
                printChannelList (ta->value ());
            }
            else if (
                const ChromaticitiesAttribute* ta =
                    dynamic_cast<const ChromaticitiesAttribute*> (a))
            {
                cout << ":\n"
                        "    red   "
                     << ta->value ().red
                     << "\n"
                        "    green "
                     << ta->value ().green
                     << "\n"
                        "    blue  "
                     << ta->value ().blue
                     << "\n"
                        "    white "
                     << ta->value ().white;
            }
            else if (
                const CompressionAttribute* ta =
                    dynamic_cast<const CompressionAttribute*> (a))
            {
                cout << ": ";
                printCompression (ta->value ());
            }
            else if (
                const DoubleAttribute* ta =
                    dynamic_cast<const DoubleAttribute*> (a))
            {
                cout << ": " << ta->value ();
            }
            else if (
                const EnvmapAttribute* ta =
                    dynamic_cast<const EnvmapAttribute*> (a))
            {
                cout << ": ";
                printEnvmap (ta->value ());
            }
            else if (
                const FloatAttribute* ta =
                    dynamic_cast<const FloatAttribute*> (a))
            {
                cout << ": " << ta->value ();
            }
            else if (
                const IntAttribute* ta = dynamic_cast<const IntAttribute*> (a))
            {
                cout << ": " << ta->value ();
            }
            else if (
                const KeyCodeAttribute* ta =
                    dynamic_cast<const KeyCodeAttribute*> (a))
            {
                cout << ":\n"
                        "    film manufacturer code "
                     << ta->value ().filmMfcCode ()
                     << "\n"
                        "    film type code "
                     << ta->value ().filmType ()
                     << "\n"
                        "    prefix "
                     << ta->value ().prefix ()
                     << "\n"
                        "    count "
                     << ta->value ().count ()
                     << "\n"
                        "    perf offset "
                     << ta->value ().perfOffset ()
                     << "\n"
                        "    perfs per frame "
                     << ta->value ().perfsPerFrame ()
                     << "\n"
                        "    perfs per count "
                     << ta->value ().perfsPerCount ();
            }
            else if (
                const LineOrderAttribute* ta =
                    dynamic_cast<const LineOrderAttribute*> (a))
            {
                cout << ": ";
                printLineOrder (ta->value ());
            }
            else if (
                const M33fAttribute* ta =
                    dynamic_cast<const M33fAttribute*> (a))
            {
                cout << ":\n"
                        "   ("
                     << ta->value ()[0][0] << " " << ta->value ()[0][1] << " "
                     << ta->value ()[0][2] << "\n    " << ta->value ()[1][0]
                     << " " << ta->value ()[1][1] << " " << ta->value ()[1][2]
                     << "\n    " << ta->value ()[2][0] << " "
                     << ta->value ()[2][1] << " " << ta->value ()[2][2] << ")";
            }
            else if (
                const M44fAttribute* ta =
                    dynamic_cast<const M44fAttribute*> (a))
            {
                cout << ":\n"
                        "   ("
                     << ta->value ()[0][0] << " " << ta->value ()[0][1] << " "
                     << ta->value ()[0][2] << " " << ta->value ()[0][3]
                     << "\n    " << ta->value ()[1][0] << " "
                     << ta->value ()[1][1] << " " << ta->value ()[1][2] << " "
                     << ta->value ()[1][3] << "\n    " << ta->value ()[2][0]
                     << " " << ta->value ()[2][1] << " " << ta->value ()[2][2]
                     << " " << ta->value ()[2][3] << "\n    "
                     << ta->value ()[3][0] << " " << ta->value ()[3][1] << " "
                     << ta->value ()[3][2] << " " << ta->value ()[3][3] << ")";
            }
            else if (
                const PreviewImageAttribute* ta =
                    dynamic_cast<const PreviewImageAttribute*> (a))
            {
                cout << ": " << ta->value ().width () << " by "
                     << ta->value ().height () << " pixels";
            }
            else if (
                const StringAttribute* ta =
                    dynamic_cast<const StringAttribute*> (a))
            {
                cout << ": \"" << ta->value () << "\"";
            }
            else if (
                const StringVectorAttribute* ta =
                    dynamic_cast<const StringVectorAttribute*> (a))
            {
                cout << ":";

                for (StringVector::const_iterator i = ta->value ().begin ();
                     i != ta->value ().end ();
                     ++i)
                {
                    cout << "\n    \"" << *i << "\"";
                }
            }
            else if (
                const RationalAttribute* ta =
                    dynamic_cast<const RationalAttribute*> (a))
            {
                cout << ": " << ta->value ().n << "/" << ta->value ().d << " ("
                     << double (ta->value ()) << ")";
            }
            else if (
                const TileDescriptionAttribute* ta =
                    dynamic_cast<const TileDescriptionAttribute*> (a))
            {
                cout << ":\n    ";

                printLevelMode (ta->value ().mode);

                cout << "\n    tile size " << ta->value ().xSize << " by "
                     << ta->value ().ySize << " pixels";

                if (ta->value ().mode != ONE_LEVEL)
                {
                    cout << "\n    level sizes rounded ";
                    printLevelRoundingMode (ta->value ().roundingMode);
                }
            }
            else if (
                const TimeCodeAttribute* ta =
                    dynamic_cast<const TimeCodeAttribute*> (a))
            {
                cout << ":\n";
                printTimeCode (ta->value ());
            }
            else if (
                const V2iAttribute* ta = dynamic_cast<const V2iAttribute*> (a))
            {
                cout << ": " << ta->value ();
            }
            else if (
                const V2fAttribute* ta = dynamic_cast<const V2fAttribute*> (a))
            {
                cout << ": " << ta->value ();
            }
            else if (
                const V3iAttribute* ta = dynamic_cast<const V3iAttribute*> (a))
            {
                cout << ": " << ta->value ();
            }
            else if (
                const V3fAttribute* ta = dynamic_cast<const V3fAttribute*> (a))
            {
                cout << ": " << ta->value ();
            }

            cout << '\n';
        }
    }

    cout << endl;
}